

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestMap_Test::TestBody
          (DescriptorPoolTypeResolverTest_TestMap_Test *this)

{
  bool bVar1;
  pointer pTVar2;
  char *pcVar3;
  char *pcVar4;
  RepeatedPtrField<google::protobuf::Option> *options;
  char *in_R9;
  char *expected_predicate_value;
  string_view sVar5;
  string_view full_name;
  string_view full_name_00;
  int in_stack_fffffffffffffce8;
  string local_2e0;
  AssertHelper local_2c0;
  Message local_2b8;
  string_view local_2b0;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_268;
  Message local_260;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  string local_248;
  Status local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1e8;
  Message local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  string local_1c8;
  char *local_1a8;
  char *local_1a0;
  string_view local_198;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_150;
  Message local_148;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__1;
  string local_110;
  AssertHelper local_f0;
  Message local_e8 [3];
  string local_d0 [32];
  Status local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  Type type;
  DescriptorPoolTypeResolverTest_TestMap_Test *this_local;
  
  Type::Type((Type *)&gtest_ar_.message_);
  pTVar2 = std::
           unique_ptr<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ::operator->(&(this->super_DescriptorPoolTypeResolverTest).resolver_);
  GetTypeUrl<proto2_unittest::TestMap>();
  (*pTVar2->_vptr_TypeResolver[2])(&local_b0,pTVar2,local_d0,&gtest_ar_.message_);
  local_a1 = absl::lts_20250127::Status::ok(&local_b0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  absl::lts_20250127::Status::~Status(&local_b0);
  std::__cxx11::string::~string(local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)local_a0,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType(GetTypeUrl<proto2_unittest::TestMap>(), &type) .ok()"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x144,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    testing::Message::~Message(local_e8);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_140,"map_int32_int32");
    sVar5._M_str = (char *)0x1;
    sVar5._M_len = (size_t)local_140._M_str;
    expected_predicate_value = (char *)0x1;
    local_129 = HasField((anon_unknown_0 *)&gtest_ar_.message_,(Type *)0x3,0xb,
                         (Kind)local_140._M_len,sVar5,in_stack_fffffffffffffce8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_128,&local_129,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    pcVar3 = (char *)local_140._M_len;
    if (!bVar1) {
      testing::Message::Message(&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_128,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_MESSAGE, \"map_int32_int32\", 1)"
                 ,"false","true",expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      pcVar3 = (char *)0x146;
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x146,pcVar4);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_198,"map_int32_int32");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1d8,"proto2_unittest.TestMap.MapInt32Int32Entry");
    full_name._M_str = pcVar3;
    full_name._M_len = (size_t)local_1d8._M_str;
    util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_
              (&local_1c8,(_anonymous_namespace_ *)local_1d8._M_len,full_name);
    sVar5 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1c8);
    local_1a0 = sVar5._M_str;
    pcVar3 = (char *)sVar5._M_len;
    local_1a8 = pcVar3;
    local_181 = CheckFieldTypeUrl((Type *)&gtest_ar_.message_,local_198,sVar5);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_180,&local_181,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3.message_,(internal *)local_180,
                 (AssertionResult *)
                 "CheckFieldTypeUrl( type, \"map_int32_int32\", GetTypeUrl(\"proto2_unittest.TestMap.MapInt32Int32Entry\"))"
                 ,"false","true",expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      pcVar3 = (char *)0x149;
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x149,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
      testing::Message::~Message(&local_1e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    pTVar2 = std::
             unique_ptr<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
             ::operator->(&(this->super_DescriptorPoolTypeResolverTest).resolver_);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_258,"proto2_unittest.TestMap.MapInt32Int32Entry");
    full_name_00._M_str = pcVar3;
    full_name_00._M_len = (size_t)local_258._M_str;
    util::(anonymous_namespace)::GetTypeUrl_abi_cxx11_
              (&local_248,(_anonymous_namespace_ *)local_258._M_len,full_name_00);
    (*pTVar2->_vptr_TypeResolver[2])(&local_228,pTVar2,&local_248,&gtest_ar_.message_);
    local_219 = absl::lts_20250127::Status::ok(&local_228);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_218,&local_219,(type *)0x0);
    absl::lts_20250127::Status::~Status(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__4.message_,(internal *)local_218,
                 (AssertionResult *)
                 "resolver_ ->ResolveMessageType( GetTypeUrl(\"proto2_unittest.TestMap.MapInt32Int32Entry\"), &type) .ok()"
                 ,"false","true",expected_predicate_value);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x14f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_260);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      options = Type::options((Type *)&gtest_ar_.message_);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2b0,"map_entry");
      local_299 = HasBoolOption(options,local_2b0,true);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_298,&local_299,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
      if (!bVar1) {
        testing::Message::Message(&local_2b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2e0,(internal *)local_298,
                   (AssertionResult *)"HasBoolOption(type.options(), \"map_entry\", true)","false",
                   "true",expected_predicate_value);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_2c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                   ,0x150,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
        testing::internal::AssertHelper::~AssertHelper(&local_2c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        testing::Message::~Message(&local_2b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  Type::~Type((Type *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestMap) {
  Type type;
  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(GetTypeUrl<proto2_unittest::TestMap>(), &type)
          .ok());
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_MESSAGE,
                       "map_int32_int32", 1));
  EXPECT_TRUE(CheckFieldTypeUrl(
      type, "map_int32_int32",
      GetTypeUrl("proto2_unittest.TestMap.MapInt32Int32Entry")));

  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(
              GetTypeUrl("proto2_unittest.TestMap.MapInt32Int32Entry"), &type)
          .ok());
  EXPECT_TRUE(HasBoolOption(type.options(), "map_entry", true));
}